

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O1

bool __thiscall FIX::Message::setStringHeader(Message *this,string *string)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  size_type pos;
  FieldBase field;
  size_type local_98;
  FieldBase local_90;
  
  clear(this);
  local_98 = 0;
  iVar3 = 0;
  do {
    if (string->_M_string_length <= local_98) goto LAB_00184a8d;
    extractField(&local_90,this,string,&local_98,(DataDictionary *)0x0,(DataDictionary *)0x0,
                 (Group *)0x0);
    if (iVar3 < 3) {
      lVar2 = (long)iVar3;
      iVar3 = iVar3 + 1;
      iVar4 = 1;
      if ((&headerOrder)[lVar2] == local_90.m_tag) goto LAB_00184a57;
    }
    else {
LAB_00184a57:
      bVar1 = isHeaderField(local_90.m_tag);
      iVar4 = 3;
      if (bVar1) {
        iVar4 = 0;
        std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::push_back
                  (&(this->m_header).super_FieldMap.m_fields,&local_90);
      }
    }
    FieldBase::~FieldBase(&local_90);
  } while (iVar4 == 0);
  if (iVar4 == 3) {
LAB_00184a8d:
    FieldMap::sortFields(&(this->m_header).super_FieldMap);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Message::setStringHeader( const std::string& string )
{
  clear();

  std::string::size_type pos = 0;
  int count = 0;

  while ( pos < string.size() )
  {
    FieldBase field = extractField( string, pos );
    if ( count < 3 && headerOrder[ count++ ] != field.getTag() )
      return false;

    if ( isHeaderField( field ) )
      m_header.appendField( field );
    else break;
  }

  m_header.sortFields();
  return true;
}